

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe8At3(uint8_t *buf)

{
  return (ulong)(byte)(*buf << 3 | buf[1] >> 5);
}

Assistant:

std::uint64_t readFlUIntBe8At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 3;
    res |= (buf[1] >> 5);
    res &= UINT64_C(0xff);
    return res;
}